

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O2

LY_ERR plugins_load_module(char *pathname)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ly_bool lVar3;
  LY_ERR LVar4;
  void *object;
  undefined8 uVar5;
  
  dlerror();
  LVar4 = LY_ESYS;
  object = (void *)dlopen();
  if (object == (void *)0x0) {
    uVar5 = dlerror();
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,"Loading \"%s\" as a plugin failed (%s).",pathname,uVar5);
  }
  else {
    LVar4 = LY_SUCCESS;
    lVar3 = ly_set_contains(&plugins_handlers,object,(uint32_t *)0x0);
    uVar2 = plugins_types.count;
    uVar1 = plugins_extensions.count;
    if (lVar3 == '\0') {
      LVar4 = plugins_load(object,pathname,LYPLG_TYPE);
      if (((LVar4 == LY_SUCCESS) &&
          (LVar4 = plugins_load(object,pathname,LYPLG_EXTENSION), LVar4 == LY_SUCCESS)) &&
         (LVar4 = ly_set_add(&plugins_handlers,object,'\x01',(uint32_t *)0x0), LVar4 == LY_SUCCESS))
      {
        return LY_SUCCESS;
      }
      dlclose(object);
      while (uVar2 < plugins_types.count) {
        ly_set_rm_index(&plugins_types,plugins_types.count - 1,(_func_void_void_ptr *)0x0);
      }
      while (uVar1 < plugins_extensions.count) {
        ly_set_rm_index(&plugins_extensions,plugins_extensions.count - 1,(_func_void_void_ptr *)0x0)
        ;
      }
    }
    else {
      ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Plugin \"%s\" already loaded.",pathname);
      dlclose(object);
    }
  }
  return LVar4;
}

Assistant:

static LY_ERR
plugins_load_module(const char *pathname)
{
    LY_ERR ret = LY_SUCCESS;
    void *dlhandler;
    uint32_t types_count = 0, extensions_count = 0;

    dlerror();    /* Clear any existing error */

    dlhandler = dlopen(pathname, RTLD_NOW);
    if (!dlhandler) {
        LOGERR(NULL, LY_ESYS, "Loading \"%s\" as a plugin failed (%s).", pathname, dlerror());
        return LY_ESYS;
    }

    if (ly_set_contains(&plugins_handlers, dlhandler, NULL)) {
        /* the plugin is already loaded */
        LOGVRB("Plugin \"%s\" already loaded.", pathname);

        /* keep the correct refcount */
        dlclose(dlhandler);
        return LY_SUCCESS;
    }

    /* remember the current plugins lists for recovery */
    types_count = plugins_types.count;
    extensions_count = plugins_extensions.count;

    /* type plugin */
    ret = plugins_load(dlhandler, pathname, LYPLG_TYPE);
    LY_CHECK_GOTO(ret, error);

    /* extension plugin */
    ret = plugins_load(dlhandler, pathname, LYPLG_EXTENSION);
    LY_CHECK_GOTO(ret, error);

    /* remember the dynamic plugin */
    ret = ly_set_add(&plugins_handlers, dlhandler, 1, NULL);
    LY_CHECK_GOTO(ret, error);

    return LY_SUCCESS;

error:
    dlclose(dlhandler);

    /* revert changes in the lists */
    while (plugins_types.count > types_count) {
        ly_set_rm_index(&plugins_types, plugins_types.count - 1, NULL);
    }
    while (plugins_extensions.count > extensions_count) {
        ly_set_rm_index(&plugins_extensions, plugins_extensions.count - 1, NULL);
    }

    return ret;
}